

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_xref.c
# Opt level: O0

HPDF_XrefEntry HPDF_Xref_GetEntryByObjectId(HPDF_Xref xref,HPDF_UINT obj_id)

{
  HPDF_XrefEntry p_Var1;
  HPDF_XrefEntry entry;
  HPDF_Xref p_Stack_28;
  HPDF_UINT i;
  HPDF_Xref tmp_xref;
  HPDF_UINT obj_id_local;
  HPDF_Xref xref_local;
  
  p_Stack_28 = xref;
  while( true ) {
    if (p_Stack_28 == (HPDF_Xref)0x0) {
      return (HPDF_XrefEntry)0x0;
    }
    if (obj_id < p_Stack_28->entries->count + p_Stack_28->start_offset) break;
    if (p_Stack_28->start_offset < obj_id) {
      for (entry._4_4_ = 0; entry._4_4_ < p_Stack_28->entries->count; entry._4_4_ = entry._4_4_ + 1)
      {
        if (p_Stack_28->start_offset + entry._4_4_ == obj_id) {
          p_Var1 = HPDF_Xref_GetEntry(p_Stack_28,entry._4_4_);
          return p_Var1;
        }
      }
    }
    p_Stack_28 = p_Stack_28->prev;
  }
  HPDF_SetError(xref->error,0x1034,0);
  return (HPDF_XrefEntry)0x0;
}

Assistant:

HPDF_XrefEntry
HPDF_Xref_GetEntryByObjectId  (HPDF_Xref  xref,
                               HPDF_UINT  obj_id)
{
    HPDF_Xref tmp_xref = xref;

    HPDF_PTRACE((" HPDF_Xref_GetEntryByObjectId\n"));

    while (tmp_xref) {
        HPDF_UINT i;

        if (tmp_xref->entries->count + tmp_xref->start_offset > obj_id) {
            HPDF_SetError (xref->error, HPDF_INVALID_OBJ_ID, 0);
            return NULL;
        }

        if (tmp_xref->start_offset < obj_id) {
            for (i = 0; i < tmp_xref->entries->count; i++) {
                if (tmp_xref->start_offset + i == obj_id) {
                    HPDF_XrefEntry entry = HPDF_Xref_GetEntry(tmp_xref, i);

                    return entry;
                }
            }
        }

        tmp_xref = tmp_xref->prev;
    }

    return NULL;
}